

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_*>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>
::destructor_impl(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_*>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>
                  *this)

{
  bool bVar1;
  size_t sVar2;
  slot_type *slot;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_*>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>
  *this_local;
  
  sVar2 = capacity(this);
  if (sVar2 != 0) {
    bVar1 = is_soo(this);
    if (bVar1) {
      bVar1 = empty(this);
      if (!bVar1) {
        slot = soo_slot(this);
        destroy(this,slot);
      }
    }
    else {
      destroy_slots(this);
      dealloc(this);
    }
  }
  return;
}

Assistant:

inline void destructor_impl() {
    if (SwisstableGenerationsEnabled() &&
        capacity() >= InvalidCapacity::kMovedFrom) {
      return;
    }
    if (capacity() == 0) return;
    if (is_soo()) {
      if (!empty()) {
        ABSL_SWISSTABLE_IGNORE_UNINITIALIZED(destroy(soo_slot()));
      }
      return;
    }
    destroy_slots();
    dealloc();
  }